

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSONConfigurePresets.cxx
# Opt level: O2

ReadFileResult
anon_unknown.dwarf_a46a4f::VariableHelper
          (optional<cmCMakePresetsGraph::CacheVariable> *out,Value *value)

{
  bool bVar1;
  ReadFileResult RVar2;
  char *__s;
  allocator<char> local_52;
  allocator<char> local_51;
  undefined1 local_50 [32];
  String local_30;
  
  bVar1 = Json::Value::isBool(value);
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>((string *)local_50,"BOOL",&local_52);
    bVar1 = Json::Value::asBool(value);
    __s = "FALSE";
    if (bVar1) {
      __s = "TRUE";
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)(local_50 + 0x20),__s,&local_51);
  }
  else {
    bVar1 = Json::Value::isString(value);
    if (!bVar1) {
      bVar1 = Json::Value::isObject(value);
      if (bVar1) {
        std::optional<cmCMakePresetsGraph::CacheVariable>::emplace<>(out);
        RVar2 = cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::
                Object<cmCMakePresetsGraph::CacheVariable>::operator()
                          ((Object<cmCMakePresetsGraph::CacheVariable> *)
                           (anonymous_namespace)::VariableObjectHelper,(CacheVariable *)out,value);
        return RVar2;
      }
      bVar1 = Json::Value::isNull(value);
      if (bVar1) {
        std::_Optional_payload_base<cmCMakePresetsGraph::CacheVariable>::_M_reset
                  ((_Optional_payload_base<cmCMakePresetsGraph::CacheVariable> *)out);
        return READ_OK;
      }
      return INVALID_VARIABLE;
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)local_50,"",&local_52);
    Json::Value::asString_abi_cxx11_((String *)(local_50 + 0x20),value);
  }
  std::optional<cmCMakePresetsGraph::CacheVariable>::operator=(out,(CacheVariable *)local_50);
  cmCMakePresetsGraph::CacheVariable::~CacheVariable((CacheVariable *)local_50);
  return READ_OK;
}

Assistant:

ReadFileResult VariableHelper(cm::optional<CacheVariable>& out,
                              const Json::Value* value)
{
  if (value->isBool()) {
    out = CacheVariable{
      /*Type=*/"BOOL",
      /*Value=*/value->asBool() ? "TRUE" : "FALSE",
    };
    return ReadFileResult::READ_OK;
  }
  if (value->isString()) {
    out = CacheVariable{
      /*Type=*/"",
      /*Value=*/value->asString(),
    };
    return ReadFileResult::READ_OK;
  }
  if (value->isObject()) {
    out.emplace();
    return VariableObjectHelper(*out, value);
  }
  if (value->isNull()) {
    out = cm::nullopt;
    return ReadFileResult::READ_OK;
  }
  return ReadFileResult::INVALID_VARIABLE;
}